

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O0

UBool __thiscall icu_63::UVector::removeAll(UVector *this,UVector *other)

{
  int32_t iVar1;
  int local_20;
  int32_t j;
  int32_t i;
  UBool changed;
  UVector *other_local;
  UVector *this_local;
  
  j._3_1_ = '\0';
  local_20 = 0;
  while( true ) {
    iVar1 = size(other);
    if (iVar1 <= local_20) break;
    iVar1 = indexOf(this,other->elements[local_20],0,'\0');
    if (-1 < iVar1) {
      removeElementAt(this,iVar1);
      j._3_1_ = '\x01';
    }
    local_20 = local_20 + 1;
  }
  return j._3_1_;
}

Assistant:

UBool UVector::removeAll(const UVector& other) {
    UBool changed = FALSE;
    for (int32_t i=0; i<other.size(); ++i) {
        int32_t j = indexOf(other.elements[i]);
        if (j >= 0) {
            removeElementAt(j);
            changed = TRUE;
        }
    }
    return changed;
}